

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void telnet_size(Backend *be,int width,int height)

{
  int iVar1;
  size_t sVar2;
  int local_3c;
  char local_38 [4];
  int n;
  uchar b [24];
  Telnet *telnet;
  int height_local;
  int width_local;
  Backend *be_local;
  
  b._16_8_ = be + -10;
  *(int *)&be[-8].interactor = width;
  *(int *)((long)&be[-8].interactor + 4) = height;
  if ((((Backend *)b._16_8_)->vt != (BackendVtable *)0x0) && (*(int *)&be[-7].interactor == 1)) {
    local_38[0] = -1;
    local_38[1] = 0xfa;
    local_38[2] = 0x1f;
    local_38[3] = (char)((uint)*(undefined4 *)&be[-8].interactor >> 8);
    local_3c = 4;
    if (local_38[3] == -1) {
      local_3c = 5;
      n._0_1_ = 0xff;
    }
    local_38[local_3c] = (char)*(undefined4 *)&be[-8].interactor;
    iVar1 = local_3c + 1;
    if (local_38[local_3c] == -1) {
      local_38[local_3c + 1] = -1;
      iVar1 = local_3c + 2;
    }
    local_3c = iVar1;
    local_38[local_3c] = (char)((uint)*(undefined4 *)((long)&be[-8].interactor + 4) >> 8);
    iVar1 = local_3c + 1;
    if (local_38[local_3c] == -1) {
      local_38[local_3c + 1] = -1;
      iVar1 = local_3c + 2;
    }
    local_3c = iVar1;
    local_38[local_3c] = (char)*(undefined4 *)((long)&be[-8].interactor + 4);
    iVar1 = local_3c + 1;
    if (local_38[local_3c] == -1) {
      local_38[local_3c + 1] = -1;
      iVar1 = local_3c + 2;
    }
    local_3c = iVar1;
    local_38[local_3c] = -1;
    local_38[local_3c + 1] = -0x10;
    sVar2 = sk_write((Socket *)((Backend *)b._16_8_)->vt,local_38,(long)(local_3c + 2));
    *(size_t *)(b._16_8_ + 0x68) = sVar2;
    logeventf(*(LogContext **)(b._16_8_ + 0x18),"client subnegotiation: SB NAWS %d,%d",
              (ulong)*(uint *)(b._16_8_ + 0x28),(ulong)*(uint *)(b._16_8_ + 0x2c));
  }
  return;
}

Assistant:

static void telnet_size(Backend *be, int width, int height)
{
    Telnet *telnet = container_of(be, Telnet, backend);
    unsigned char b[24];
    int n;

    telnet->term_width = width;
    telnet->term_height = height;

    if (telnet->s == NULL || telnet->opt_states[o_naws.index] != ACTIVE)
        return;
    n = 0;
    b[n++] = IAC;
    b[n++] = SB;
    b[n++] = TELOPT_NAWS;
    b[n++] = telnet->term_width >> 8;
    if (b[n-1] == IAC) b[n++] = IAC;   /* duplicate any IAC byte occurs */
    b[n++] = telnet->term_width & 0xFF;
    if (b[n-1] == IAC) b[n++] = IAC;   /* duplicate any IAC byte occurs */
    b[n++] = telnet->term_height >> 8;
    if (b[n-1] == IAC) b[n++] = IAC;   /* duplicate any IAC byte occurs */
    b[n++] = telnet->term_height & 0xFF;
    if (b[n-1] == IAC) b[n++] = IAC;   /* duplicate any IAC byte occurs */
    b[n++] = IAC;
    b[n++] = SE;
    telnet->bufsize = sk_write(telnet->s, b, n);
    logeventf(telnet->logctx, "client subnegotiation: SB NAWS %d,%d",
              telnet->term_width, telnet->term_height);
}